

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * __thiscall
el::base::utils::OS::getBashOutput_abi_cxx11_(string *__return_storage_ptr__,OS *this,char *command)

{
  undefined8 __s;
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  char hBuff [4096];
  allocator local_1029 [4105];
  
  if ((this != (OS *)0x0) && (__stream = popen((char *)this,"r"), __stream != (FILE *)0x0)) {
    __s = (long)local_1029 + 1;
    pcVar1 = fgets((char *)__s,0x1000,__stream);
    pclose(__stream);
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen((char *)__s);
      if (*(char *)(__s + (sVar2 - 1)) == '\n') {
        local_1029[sVar2] = (allocator)0x0;
      }
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(char *)((long)local_1029 + 1),local_1029);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

const std::string OS::getBashOutput(const char* command) {
#if (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
  if (command == nullptr) {
    return std::string();
  }
  FILE* proc = nullptr;
  if ((proc = popen(command, "r")) == nullptr) {
    ELPP_INTERNAL_ERROR("\nUnable to run command [" << command << "]", true);
    return std::string();
  }
  char hBuff[4096];
  if (fgets(hBuff, sizeof(hBuff), proc) != nullptr) {
    pclose(proc);
    if (hBuff[strlen(hBuff) - 1] == '\n') {
      hBuff[strlen(hBuff) - 1] = '\0';
    }
    return std::string(hBuff);
  } else {
    pclose(proc);
  }
  return std::string();
#else
  ELPP_UNUSED(command);
  return std::string();
#endif  // (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
}